

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_BOMError_Test::
ParseMessageTest_BOMError_Test(ParseMessageTest_BOMError_Test *this)

{
  ParseMessageTest_BOMError_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseMessageTest);
  (this->super_ParseMessageTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseMessageTest_BOMError_Test_02a0a0c0;
  return;
}

Assistant:

TEST_F(ParseMessageTest, BOMError) {
  char input[] =
      "   message TestMessage {\n"
      "  required int32 foo = 1;\n"
      "}\n";
  input[0] = (char)0xEF;
  ExpectHasErrors(input,
                  "0:1: Proto file starts with 0xEF but not UTF-8 BOM. "
                  "Only UTF-8 is accepted for proto file.\n"
                  "0:0: Expected top-level statement (e.g. \"message\").\n");
}